

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestMemCheckCommand::Clone(cmCTestMemCheckCommand *this)

{
  cmCommand *this_00;
  cmCTestMemCheckCommand *ni;
  cmCTestMemCheckCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0xa8);
  cmCTestMemCheckCommand((cmCTestMemCheckCommand *)this_00);
  this_00[1]._vptr_cmCommand =
       (_func_int **)
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  this_00[1].Makefile =
       (cmMakefile *)
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
       CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestMemCheckCommand* ni = new cmCTestMemCheckCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }